

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LEB128.cpp
# Opt level: O3

uint llvm::getULEB128Size(uint64_t Value)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = 0;
  do {
    uVar2 = uVar2 + 1;
    bVar1 = 0x7f < Value;
    Value = Value >> 7;
  } while (bVar1);
  return uVar2;
}

Assistant:

unsigned getULEB128Size(uint64_t Value) {
  unsigned Size = 0;
  do {
    Value >>= 7;
    Size += sizeof(int8_t);
  } while (Value);
  return Size;
}